

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O2

void zlib_message(zlib *zlib,int unexpected)

{
  uint uVar1;
  FILE *__stream;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  if ((undefined1  [96])((undefined1  [96])*zlib->global & (undefined1  [96])0x1) ==
      (undefined1  [96])0x0) {
    return;
  }
  pcVar4 = (zlib->z).msg;
  pcVar3 = "[no message]";
  if (pcVar4 != (char *)0x0) {
    pcVar3 = pcVar4;
  }
  fputs(zlib->file->file_name,_stderr);
  type_sep((FILE *)_stderr);
  type_name(zlib->chunk->chunk_type,(FILE *)_stderr);
  __stream = _stderr;
  pcVar4 = "unexpected ";
  if (unexpected == 0) {
    pcVar4 = "";
  }
  uVar1 = zlib->rc;
  pcVar2 = zlib_rc(zlib);
  fprintf(__stream,": %szlib error: %d (%s) (%s)\n",pcVar4,(ulong)uVar1,pcVar2,pcVar3);
  return;
}

Assistant:

static void
zlib_message(struct zlib *zlib, int unexpected)
   /* Output a message given a zlib rc */
{
   if (zlib->global->errors)
   {
      const char *reason = zlib->z.msg;

      if (reason == NULL)
         reason = "[no message]";

      fputs(zlib->file->file_name, stderr);
      type_sep(stderr);
      type_name(zlib->chunk->chunk_type, stderr);
      fprintf(stderr, ": %szlib error: %d (%s) (%s)\n",
         unexpected ? "unexpected " : "", zlib->rc, zlib_rc(zlib), reason);
   }
}